

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::BranchToBlock
          (MergeReturnPass *this,BasicBlock *block,uint32_t target)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  this_00;
  Op OVar1;
  uint32_t pred_blk_id;
  Instruction *pIVar2;
  IRContext *pIVar3;
  CFG *pCVar4;
  DefUseManager *this_01;
  mapped_type *this_02;
  bool bVar5;
  Operand *local_108;
  uint32_t local_dc;
  allocator<spvtools::opt::Operand> local_d5;
  uint32_t local_d4;
  iterator local_d0;
  undefined8 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  Operand local_98;
  iterator local_68;
  _func_int **local_60;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_58;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_40;
  Instruction *return_inst;
  BasicBlock *target_block;
  undefined1 local_28 [20];
  uint32_t target_local;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  local_28._12_4_ = target;
  unique0x1000036b = block;
  block_local = (BasicBlock *)this;
  BasicBlock::tail((BasicBlock *)local_28);
  pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->
                     ((iterator_template<spvtools::opt::Instruction> *)local_28);
  OVar1 = opt::Instruction::opcode(pIVar2);
  bVar5 = true;
  if (OVar1 != OpReturn) {
    BasicBlock::tail((BasicBlock *)&target_block);
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)&target_block);
    OVar1 = opt::Instruction::opcode(pIVar2);
    bVar5 = OVar1 == OpReturnValue;
  }
  if (bVar5) {
    RecordReturned(this,stack0xffffffffffffffe8);
    RecordReturnValue(this,stack0xffffffffffffffe8);
  }
  pIVar3 = Pass::context((Pass *)this);
  return_inst = (Instruction *)IRContext::get_instr_block(pIVar3,local_28._12_4_);
  pIVar2 = BasicBlock::GetLoopMergeInst((BasicBlock *)return_inst);
  if (pIVar2 != (Instruction *)0x0) {
    pCVar4 = Pass::cfg((Pass *)this);
    CFG::SplitLoopHeader(pCVar4,(BasicBlock *)return_inst);
  }
  UpdatePhiNodes(this,stack0xffffffffffffffe8,(BasicBlock *)return_inst);
  local_40._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )BasicBlock::terminator(stack0xffffffffffffffe8);
  opt::Instruction::SetOpcode
            ((Instruction *)
             local_40._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl,OpBranch);
  this_00._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = local_40._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl;
  local_d4 = local_28._12_4_;
  local_d0 = &local_d4;
  local_c8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_d0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list);
  Operand::Operand(&local_98,SPV_OPERAND_TYPE_ID,&local_c0);
  local_68 = &local_98;
  local_60 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_d5);
  __l._M_len = (size_type)local_60;
  __l._M_array = local_68;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_58,__l,&local_d5);
  opt::Instruction::ReplaceOperands
            ((Instruction *)
             this_00._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_d5);
  local_108 = (Operand *)&local_68;
  do {
    local_108 = local_108 + -1;
    Operand::~Operand(local_108);
  } while (local_108 != &local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
  pIVar3 = Pass::context((Pass *)this);
  this_01 = IRContext::get_def_use_mgr(pIVar3);
  analysis::DefUseManager::AnalyzeInstDefUse
            (this_01,(Instruction *)
                     local_40._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
  this_02 = std::
            unordered_map<spvtools::opt::BasicBlock_*,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->new_edges_,(key_type *)&return_inst);
  local_dc = BasicBlock::id(stack0xffffffffffffffe8);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            (this_02,&local_dc);
  pCVar4 = Pass::cfg((Pass *)this);
  pred_blk_id = BasicBlock::id(stack0xffffffffffffffe8);
  CFG::AddEdge(pCVar4,pred_blk_id,local_28._12_4_);
  return;
}

Assistant:

void MergeReturnPass::BranchToBlock(BasicBlock* block, uint32_t target) {
  if (block->tail()->opcode() == spv::Op::OpReturn ||
      block->tail()->opcode() == spv::Op::OpReturnValue) {
    RecordReturned(block);
    RecordReturnValue(block);
  }

  BasicBlock* target_block = context()->get_instr_block(target);
  if (target_block->GetLoopMergeInst()) {
    cfg()->SplitLoopHeader(target_block);
  }
  UpdatePhiNodes(block, target_block);

  Instruction* return_inst = block->terminator();
  return_inst->SetOpcode(spv::Op::OpBranch);
  return_inst->ReplaceOperands({{SPV_OPERAND_TYPE_ID, {target}}});
  context()->get_def_use_mgr()->AnalyzeInstDefUse(return_inst);
  new_edges_[target_block].insert(block->id());
  cfg()->AddEdge(block->id(), target);
}